

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int JsUtil::
    BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
    ::GetNextFreeEntryIndex(EntryType *freeEntry)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int iVar4;
  
  iVar4 = (freeEntry->
          super_SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
          ).
          super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .
          super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
          .
          super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>_>
          .
          super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
          .next;
  if (-2 < iVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x32a,"(IsFreeEntry(freeEntry))","IsFreeEntry(freeEntry)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    iVar4 = (freeEntry->
            super_SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
            ).
            super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .
            super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
            .
            super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>_>
            .
            super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
            .next;
  }
  return -2 - iVar4;
}

Assistant:

static int GetNextFreeEntryIndex(const EntryType &freeEntry)
        {
            Assert(IsFreeEntry(freeEntry));
            return FreeListSentinel - freeEntry.next;
        }